

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preBegin__interval
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  uint uVar1;
  ParserChar *text;
  size_t sVar2;
  long lVar3;
  bool bVar4;
  interval__AttributeData *piVar5;
  StringHash SVar6;
  char **ppcVar7;
  long lVar8;
  xmlChar **ppxVar9;
  bool failed;
  ParserChar *attributeValue;
  StackMemoryManager *local_130;
  XSList<GeneratedSaxParser::ParserString> *local_128;
  URI *local_120;
  URI local_118;
  
  piVar5 = GeneratedSaxParser::ParserTemplateBase::newData<COLLADASaxFWL15::interval__AttributeData>
                     ((ParserTemplateBase *)this,attributeDataPtr);
  ppxVar9 = attributes->attributes;
  if (ppxVar9 != (xmlChar **)0x0) {
    local_120 = &piVar5->href;
    local_128 = &piVar5->_class;
    local_130 = &(this->
                 super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                 ).super_ParserTemplateBase.mStackMemoryManager;
    for (; text = *ppxVar9, text != (ParserChar *)0x0; ppxVar9 = ppxVar9 + 2) {
      SVar6 = GeneratedSaxParser::Utils::calculateStringHash(text);
      attributeValue = ppxVar9[1];
      if (SVar6 == 0x6f4) {
        piVar5->id = attributeValue;
      }
      else if (SVar6 == 0x6f8b6) {
        GeneratedSaxParser::Utils::toURI(&local_118,&attributeValue,&failed);
        COLLADABU::URI::operator=(local_120,&local_118);
        COLLADABU::URI::~URI(&local_118);
        if ((failed == true) &&
           (bVar4 = GeneratedSaxParser::ParserTemplateBase::handleError
                              ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                               ERROR_ATTRIBUTE_PARSING_FAILED,0x5ac9b7c,0x6f8b6,attributeValue),
           bVar4)) {
          return false;
        }
        if ((failed & 1U) == 0) {
          *(byte *)&piVar5->present_attributes = (byte)piVar5->present_attributes | 2;
        }
      }
      else if (SVar6 == 0x7f8b6) {
        piVar5->xref = attributeValue;
      }
      else if (SVar6 == 0x6a28a3) {
        bVar4 = GeneratedSaxParser::
                ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                ::
                characterData2List<GeneratedSaxParser::ParserString,_&GeneratedSaxParser::Utils::toStringListItem>
                          (&this->
                            super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                           ,attributeValue,local_128);
        if (bVar4) {
          *(byte *)&piVar5->present_attributes = (byte)piVar5->present_attributes | 1;
        }
        else {
          SVar6 = 0x6a28a3;
LAB_00788365:
          bVar4 = GeneratedSaxParser::ParserTemplateBase::handleError
                            ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                             ERROR_ATTRIBUTE_PARSING_FAILED,0x5ac9b7c,SVar6,attributeValue);
          if (bVar4) {
            return false;
          }
        }
      }
      else if (SVar6 == 0x7ac025) {
        piVar5->style = attributeValue;
      }
      else if (SVar6 == 0xa36ace5) {
        SVar6 = GeneratedSaxParser::Utils::calculateStringHash(attributeValue,(bool *)&local_118);
        lVar3 = 0;
        do {
          lVar8 = lVar3;
          if (lVar8 + 0x10 == 0x50) {
            local_118.mUriString._M_dataplus._M_p._0_1_ = 1;
            piVar5->closure = ENUM__mathml__interval__closure__COUNT;
            SVar6 = 0xa36ace5;
            goto LAB_00788365;
          }
          lVar3 = lVar8 + 0x10;
        } while (*(StringHash *)((long)&ENUM__mathml__interval__closureMap + lVar8) != SVar6);
        piVar5->closure = *(ENUM__mathml__interval__closure *)((long)&DAT_008694d8 + lVar8);
      }
      else {
        if ((piVar5->unknownAttributes).data == (char **)0x0) {
          ppcVar7 = (char **)GeneratedSaxParser::StackMemoryManager::newObject(local_130,0x10);
        }
        else {
          ppcVar7 = (char **)GeneratedSaxParser::StackMemoryManager::growObject(local_130,0x10);
        }
        (piVar5->unknownAttributes).data = ppcVar7;
        sVar2 = (piVar5->unknownAttributes).size;
        ppcVar7[sVar2] = text;
        (piVar5->unknownAttributes).data[sVar2 + 1] = attributeValue;
        (piVar5->unknownAttributes).size = sVar2 + 2;
      }
    }
  }
  uVar1 = piVar5->present_attributes;
  if ((uVar1 & 1) == 0) {
    (piVar5->_class).data = (ParserString *)0x0;
    (piVar5->_class).size = 0;
  }
  if ((uVar1 & 2) == 0) {
    COLLADABU::URI::URI(&local_118,"");
    COLLADABU::URI::operator=(&piVar5->href,&local_118);
    COLLADABU::URI::~URI(&local_118);
  }
  return true;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__interval( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__interval( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

interval__AttributeData* attributeData = newData<interval__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_CLOSURE:
    {
bool failed;
attributeData->closure = Utils::toEnum<ENUM__mathml__interval__closure, StringHash, ENUM__mathml__interval__closure__COUNT>(attributeValue, failed, ENUM__mathml__interval__closureMap, Utils::calculateStringHash);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_INTERVAL,
        HASH_ATTRIBUTE_CLOSURE,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_CLASS:
    {
bool failed;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
failed = !characterData2StringList(attributeValue, attributeData->_class, &validate__NMTOKEN, HASH_ELEMENT_INTERVAL, HASH_ATTRIBUTE_CLASS);
    }
    else
    {
failed = !characterData2StringList(attributeValue, attributeData->_class);
    }
#else
    {
failed = !characterData2StringList(attributeValue, attributeData->_class);
    } // validation
#endif
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_INTERVAL,
        HASH_ATTRIBUTE_CLASS,
        attributeValue))
{
    return false;
}
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__NMTOKENS(attributeData->_class.data, attributeData->_class.size);
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_INTERVAL,
            HASH_ATTRIBUTE_CLASS,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

if ( !failed )
    attributeData->present_attributes |= interval__AttributeData::ATTRIBUTE__CLASS_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_STYLE:
    {

attributeData->style = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_XREF:
    {

attributeData->xref = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_ID:
    {

attributeData->id = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_HREF:
    {
bool failed;
attributeData->href = GeneratedSaxParser::Utils::toURI(&attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_INTERVAL,
        HASH_ATTRIBUTE_HREF,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= interval__AttributeData::ATTRIBUTE_HREF_PRESENT;

    break;
    }
    default:
    {
        if ( !attributeData->unknownAttributes.data )
            attributeData->unknownAttributes.data = (const ParserChar**)mStackMemoryManager.newObject( 2 * sizeof( const ParserChar* ) );
        else
            attributeData->unknownAttributes.data = (const ParserChar**)mStackMemoryManager.growObject( 2 * sizeof( const ParserChar* ) );
        attributeData->unknownAttributes.data[ attributeData->unknownAttributes.size ] = attribute;
        attributeData->unknownAttributes.data[ attributeData->unknownAttributes.size+1 ] = attributeValue;
        attributeData->unknownAttributes.size += 2;

    }
    }
    }
}
if ((attributeData->present_attributes & interval__AttributeData::ATTRIBUTE__CLASS_PRESENT) == 0)
{
    attributeData->_class = GeneratedSaxParser::XSList<ParserString>();
}
if ((attributeData->present_attributes & interval__AttributeData::ATTRIBUTE_HREF_PRESENT) == 0)
{
    attributeData->href = COLLADABU::URI("");
}


    return true;
}